

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeUnsizedArray * __thiscall
ExpressionContext::GetUnsizedArrayType(ExpressionContext *this,TypeBase *type)

{
  Allocator *allocator;
  ScopeData *scope;
  TypeBase *type_00;
  TypeBase **ppTVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  MemberHandle *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  InplaceStr IVar5;
  TypeUnsizedArray *type_01;
  SynIdentifier *name;
  undefined4 extraout_var_00;
  
  if (this->typeVoid == type) {
    __assert_fail("type != typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6d4,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
  }
  if (this->typeAuto == type) {
    __assert_fail("type != typeAuto",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6d7,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID - 0x1a < 3) {
      __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6da,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
    if (type->typeID == 0) {
      __assert_fail("!isType<TypeError>(type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6db,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
  }
  type_01 = type->unsizedArrayType;
  if (type_01 == (TypeUnsizedArray *)0x0) {
    if (0xffff < type->size) {
      __assert_fail("type->size < 64 * 1024",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6e0,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
    iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x90);
    type_01 = (TypeUnsizedArray *)CONCAT44(extraout_var,iVar2);
    IVar5 = GetUnsizedArrayTypeName(this,type);
    (type_01->super_TypeStruct).super_TypeBase._vptr_TypeBase =
         (_func_int **)&PTR__TypeBase_003e60b0;
    (type_01->super_TypeStruct).super_TypeBase.typeID = 0x14;
    (type_01->super_TypeStruct).super_TypeBase.name = IVar5;
    (type_01->super_TypeStruct).super_TypeBase.arrayTypes.head = (TypeHandle *)0x0;
    (type_01->super_TypeStruct).super_TypeBase.arrayTypes.tail = (TypeHandle *)0x0;
    uVar3 = NULLC::GetStringHash(IVar5.begin,IVar5.end);
    (type_01->super_TypeStruct).super_TypeBase.nameHash = uVar3;
    (type_01->super_TypeStruct).super_TypeBase.importModule = (ModuleData *)0x0;
    (type_01->super_TypeStruct).super_TypeBase.typeIndex = 0xffffffff;
    (type_01->super_TypeStruct).super_TypeBase.refType = (TypeRef *)0x0;
    *(undefined8 *)&(type_01->super_TypeStruct).super_TypeBase.alignment = 0;
    *(undefined8 *)((long)&(type_01->super_TypeStruct).super_TypeBase.size + 4) = 0;
    *(undefined4 *)((long)&(type_01->super_TypeStruct).super_TypeBase.padding + 3) = 0;
    (type_01->super_TypeStruct).super_TypeBase.unsizedArrayType = (TypeUnsizedArray *)0x0;
    (type_01->super_TypeStruct).typeScope = (ScopeData *)0x0;
    (type_01->super_TypeStruct).members.head = (MemberHandle *)0x0;
    (type_01->super_TypeStruct).members.tail = (MemberHandle *)0x0;
    (type_01->super_TypeStruct).constants.head = (ConstantData *)0x0;
    (type_01->super_TypeStruct).constants.tail = (ConstantData *)0x0;
    (type_01->super_TypeStruct).super_TypeBase._vptr_TypeBase =
         (_func_int **)&PTR__TypeBase_003e6140;
    type_01->subType = type;
    (type_01->super_TypeStruct).super_TypeBase.isGeneric = type->isGeneric;
    (type_01->super_TypeStruct).super_TypeBase.hasPointers = true;
    PushScope(this,(TypeBase *)type_01);
    (type_01->super_TypeStruct).typeScope = this->scope;
    iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x28);
    node = (MemberHandle *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x170);
    allocator = this->allocator;
    scope = this->scope;
    type_00 = this->typeInt;
    iVar4 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
    name = (SynIdentifier *)CONCAT44(extraout_var_02,iVar4);
    (name->super_SynBase).typeID = 4;
    (name->super_SynBase).begin = (Lexeme *)0x0;
    (name->super_SynBase).end = (Lexeme *)0x0;
    (name->super_SynBase).pos.begin = (char *)0x0;
    (name->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
    (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
    (name->name).begin = "size";
    (name->name).end = "";
    uVar3 = this->uniqueVariableId;
    this->uniqueVariableId = uVar3 + 1;
    VariableData::VariableData
              ((VariableData *)CONCAT44(extraout_var_01,iVar2),allocator,(SynBase *)0x0,scope,4,
               type_00,name,8,uVar3);
    node->source = (SynBase *)0x0;
    node->variable = (VariableData *)CONCAT44(extraout_var_01,iVar2);
    node->initializer = (SynBase *)0x0;
    node->next = (MemberHandle *)0x0;
    node->listed = false;
    IntrusiveList<MemberHandle>::push_back(&(type_01->super_TypeStruct).members,node);
    ((type_01->super_TypeStruct).members.tail)->variable->isReadonly = true;
    (type_01->super_TypeStruct).super_TypeBase.alignment = 4;
    (type_01->super_TypeStruct).super_TypeBase.size = 0xc;
    PopScope(this,SCOPE_TYPE,true);
    type->unsizedArrayType = type_01;
    uVar3 = (this->types).count;
    if (uVar3 == (this->types).max) {
      SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar3);
    }
    ppTVar1 = (this->types).data;
    if (ppTVar1 == (TypeBase **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]"
                   );
    }
    uVar3 = (this->types).count;
    (this->types).count = uVar3 + 1;
    ppTVar1[uVar3] = (TypeBase *)type_01;
  }
  return type_01;
}

Assistant:

TypeUnsizedArray* ExpressionContext::GetUnsizedArrayType(TypeBase* type)
{
	// Can't have array of void
	assert(type != typeVoid);

	// Can't create array of auto types this way
	assert(type != typeAuto);

	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	if(type->unsizedArrayType)
		return type->unsizedArrayType;

	assert(type->size < 64 * 1024);

	// Create new type
	TypeUnsizedArray* result = new (get<TypeUnsizedArray>()) TypeUnsizedArray(GetUnsizedArrayTypeName(*this, type), type);

	PushScope(result);

	result->typeScope = scope;

	result->members.push_back(new (get<MemberHandle>()) MemberHandle(NULL, new (get<VariableData>()) VariableData(allocator, NULL, scope, 4, typeInt, new (get<SynIdentifier>()) SynIdentifier(InplaceStr("size")), NULLC_PTR_SIZE, uniqueVariableId++), NULL));
	result->members.tail->variable->isReadonly = true;

	result->alignment = 4;
	result->size = NULLC_PTR_SIZE + 4;

	PopScope(SCOPE_TYPE);

	// Save it for future use
	type->unsizedArrayType = result;

	types.push_back(result);

	return result;
}